

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

bool Search::search_predictNeedsExample(search_private *priv)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  
  switch(priv->state) {
  case INIT_TEST:
    return true;
  case INIT_TRAIN:
    bVar1 = true;
    if (priv->rollout_method != NO_ROLLOUT) goto switchD_0011d315_default;
    break;
  case LEARN:
    uVar3 = priv->meta_t + priv->t;
    if (priv->learn_t <= uVar3) {
      if (uVar3 == priv->learn_t) {
        return true;
      }
      if (priv->loss_declared_cnt <= priv->rollout_num_steps - 1) goto switchD_0011d315_default;
    }
  case INITIALIZE:
  case GET_TRUTH_STRING:
    bVar1 = false;
    break;
  default:
switchD_0011d315_default:
    iVar2 = choose_policy(priv,false);
    return iVar2 != -1;
  }
  return bVar1;
}

Assistant:

bool search_predictNeedsExample(search_private& priv)
{
  // this is basically copied from the logic of search_predict()
  switch (priv.state)
  {
    case INITIALIZE:
      return false;
    case GET_TRUTH_STRING:
      return false;
    case INIT_TEST:
      return true;
    case INIT_TRAIN:
      // TODO: do we need to do something here for metatasks?
      // if (priv.beam && (priv.t < priv.beam_actions.size()))
      //  return false;
      if (priv.rollout_method == NO_ROLLOUT)
        return true;
      break;
    case LEARN:
      if (priv.t + priv.meta_t < priv.learn_t)
        return false;  // TODO: in meta search mode with foreach feature we'll need it even here
      if (priv.t + priv.meta_t == priv.learn_t)
        return true;  // SPEEDUP: we really only need it on the last learn_a, but this is hard to know...
      // t > priv.learn_t
      if ((priv.rollout_num_steps > 0) && (priv.loss_declared_cnt >= priv.rollout_num_steps))
        return false;  // skipping
      break;
  }

  int pol = choose_policy(priv, false);  // choose a policy but don't advance prng
  return (pol != -1);
}